

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O0

void fread_charmie(CHAR_DATA *ch,FILE *fp)

{
  string_view fmt;
  int iVar1;
  MOB_INDEX_DATA *pMVar2;
  CHAR_DATA *ch_00;
  char *pcVar3;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  CHAR_DATA *charmed;
  int roomvnum;
  int vnum;
  FILE *in_stack_00002380;
  FILE *in_stack_00003f78;
  AFFECT_DATA *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff70;
  ROOM_INDEX_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9a;
  undefined2 in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffff9e;
  size_t in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  CHAR_DATA *ch_01;
  
  fread_number(in_stack_00002380);
  pMVar2 = get_mob_index(in_stack_ffffffffffffff6c);
  if (pMVar2 == (MOB_INDEX_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff70,
               (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    fmt._M_str = in_stack_ffffffffffffffa8;
    fmt._M_len = in_stack_ffffffffffffffa0;
    CLogger::Warn<int&>((CLogger *)
                        CONCAT26(in_stack_ffffffffffffff9e,
                                 CONCAT24(in_stack_ffffffffffffff9c,
                                          CONCAT22(in_stack_ffffffffffffff9a,
                                                   in_stack_ffffffffffffff98))),fmt,
                        (int *)CONCAT26(in_stack_ffffffffffffff96,
                                        CONCAT24(in_stack_ffffffffffffff94,
                                                 CONCAT22(in_stack_ffffffffffffff92,
                                                          in_stack_ffffffffffffff90))));
    get_mob_index(in_stack_ffffffffffffff6c);
    ch_00 = create_mobile((MOB_INDEX_DATA *)af.name);
  }
  else {
    get_mob_index(in_stack_ffffffffffffff6c);
    ch_00 = create_mobile((MOB_INDEX_DATA *)af.name);
  }
  fread_number(in_stack_00002380);
  free_pstring(in_stack_ffffffffffffff60);
  free_pstring(in_stack_ffffffffffffff60);
  free_pstring(in_stack_ffffffffffffff60);
  pcVar3 = fread_string(in_stack_00003f78);
  ch_00->name = pcVar3;
  pcVar3 = fread_string(in_stack_00003f78);
  ch_00->short_descr = pcVar3;
  pcVar3 = fread_string(in_stack_00003f78);
  ch_00->long_descr = pcVar3;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->level = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->max_hit = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->hit = iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->size = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->alignment = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->damage[0] = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->damage[1] = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->damroll = (short)iVar1;
  iVar1 = fread_number(in_stack_00002380);
  ch_00->defense_mod = (short)iVar1;
  ch_01 = ch_00;
  get_room_index(in_stack_ffffffffffffff6c);
  char_to_room((CHAR_DATA *)
               CONCAT26(in_stack_ffffffffffffff96,
                        CONCAT24(in_stack_ffffffffffffff94,
                                 CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
               in_stack_ffffffffffffff88);
  add_follower(ch_01,in_stack_ffffffffffffffd8);
  ch_01->leader = in_RDI;
  init_affect((AFFECT_DATA *)0x6297f6);
  std::pow<int,int>(0,0x62983d);
  skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (ch_01->pIndexData->vnum == 0xb55) {
    skill_lookup((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  affect_to_char(ch_00,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void fread_charmie(CHAR_DATA *ch, FILE *fp)
{
	int vnum, roomvnum;
	CHAR_DATA *charmed;
	AFFECT_DATA af;
	vnum = fread_number(fp);

	if (get_mob_index(vnum) == nullptr)
	{
		RS.Logger.Warn("Fread_charmie: bad vnum {}!!!!", vnum);
		charmed = create_mobile(get_mob_index(24594));
	}
	else
	{
		charmed = create_mobile(get_mob_index(vnum));
	}

	roomvnum = fread_number(fp);

	free_pstring(charmed->short_descr);
	free_pstring(charmed->long_descr);
	free_pstring(charmed->name);

	charmed->name = fread_string(fp);
	charmed->short_descr = fread_string(fp);
	charmed->long_descr = fread_string(fp);
	charmed->level = fread_number(fp);
	charmed->max_hit = fread_number(fp);
	charmed->hit = fread_number(fp);
	charmed->size = fread_number(fp);
	charmed->alignment = fread_number(fp);
	charmed->damage[DICE_NUMBER] = fread_number(fp);
	charmed->damage[DICE_TYPE] = fread_number(fp);
	charmed->damroll = fread_number(fp);
	charmed->defense_mod = fread_number(fp);

	char_to_room(charmed, get_room_index(roomvnum));
	add_follower(charmed, ch);

	charmed->leader = ch;

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.level = ch->level;
	af.aftype = AFT_SPELL;
	af.location = 0;
	af.modifier = 0;
	af.duration = -1;

	SET_BIT(af.bitvector, AFF_CHARM);

	af.type = skill_lookup("charm person");

	if (charmed->pIndexData->vnum == MOB_VNUM_ZOMBIE)
		af.type = skill_lookup("animate dead");

	affect_to_char(charmed, &af);
}